

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O1

void Ivy_ManCollectCut(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vNodes)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  
  vNodes->nSize = 0;
  if (0 < vLeaves->nSize) {
    lVar3 = 0;
    do {
      iVar2 = vLeaves->pArray[lVar3];
      Vec_IntPush(vNodes,iVar2);
      if (((long)iVar2 < 0) || (p->vObjs->nSize <= iVar2)) goto LAB_007f1f1e;
      puVar1 = (uint *)((long)p->vObjs->pArray[iVar2] + 8);
      *puVar1 = *puVar1 | 0x10;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vLeaves->nSize);
  }
  Ivy_ManCollectCut_rec(p,pRoot,vNodes);
  if (0 < vNodes->nSize) {
    lVar3 = 0;
    do {
      iVar2 = vNodes->pArray[lVar3];
      if (((long)iVar2 < 0) || (p->vObjs->nSize <= iVar2)) {
LAB_007f1f1e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)((long)p->vObjs->pArray[iVar2] + 8);
      *puVar1 = *puVar1 & 0xffffffef;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vNodes->nSize);
  }
  return;
}

Assistant:

void Ivy_ManCollectCut( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vNodes )
{
    int i, Leaf;
    // collect and mark the leaves
    Vec_IntClear( vNodes );
    Vec_IntForEachEntry( vLeaves, Leaf, i )
    {
        Vec_IntPush( vNodes, Leaf );
        Ivy_ManObj(p, Leaf)->fMarkA = 1;
    }
    // collect and mark the nodes
    Ivy_ManCollectCut_rec( p, pRoot, vNodes );
    // clean the nodes
    Vec_IntForEachEntry( vNodes, Leaf, i )
        Ivy_ManObj(p, Leaf)->fMarkA = 0;
}